

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O0

string * __thiscall
license::CryptoHelperLinux::exportPrivateKey_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this)

{
  char *pcVar1;
  logic_error *this_00;
  BIO_METHOD *type;
  long lVar2;
  allocator local_72;
  undefined1 local_71;
  char *local_70;
  char *pem_key;
  rsa_st *prStack_60;
  int keylen;
  RSA *rsa;
  BIO *bio_private;
  allocator local_39;
  string local_38 [32];
  CryptoHelperLinux *local_18;
  CryptoHelperLinux *this_local;
  string *dest;
  
  local_18 = this;
  this_local = (CryptoHelperLinux *)__return_storage_ptr__;
  if (this->m_pktmp != (EVP_PKEY *)0x0) {
    type = BIO_s_mem();
    rsa = (RSA *)BIO_new(type);
    prStack_60 = EVP_PKEY_get1_RSA((EVP_PKEY *)this->m_pktmp);
    PEM_write_bio_RSAPrivateKey
              ((BIO *)rsa,prStack_60,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0)
    ;
    lVar2 = BIO_ctrl((BIO *)rsa,10,0,(void *)0x0);
    pem_key._4_4_ = (int)lVar2;
    local_70 = (char *)calloc((long)(pem_key._4_4_ + 1),1);
    BIO_read((BIO *)rsa,local_70,pem_key._4_4_);
    BIO_free((BIO *)rsa);
    pcVar1 = local_70;
    local_71 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_72);
    std::allocator<char>::~allocator((allocator<char> *)&local_72);
    free(local_70);
    return __return_storage_ptr__;
  }
  bio_private._3_1_ = 1;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Export not initialized.Call generateKeyPair first.",&local_39);
  std::logic_error::logic_error(this_00,local_38);
  bio_private._3_1_ = 0;
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const string CryptoHelperLinux::exportPrivateKey() const {
	if (m_pktmp == NULL) {
		throw logic_error(string("Export not initialized.Call generateKeyPair first."));
	}
	BIO *bio_private = BIO_new(BIO_s_mem());
	RSA *rsa = EVP_PKEY_get1_RSA(m_pktmp);
	// EVP_PKEY_assign_RSA(m_pktmp, rsa);
	PEM_write_bio_RSAPrivateKey(bio_private, rsa, NULL, NULL, 0, NULL, NULL);
	// RSA_free(rsa);
	/*PEM_write_bio_PrivateKey(bio_private, m_pktmp, nullptr, nullptr, 0,
	 nullptr, nullptr);*/
	int keylen = BIO_pending(bio_private);
	char *pem_key = (char *)(calloc(keylen + 1, 1)); /* Null-terminate */
	BIO_read(bio_private, pem_key, keylen);
	BIO_free(bio_private);
	string dest(pem_key);
	free(pem_key);
	return dest;
}